

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

DInterpolation * __thiscall sector_t::SetInterpolation(sector_t *this,int position,bool attach)

{
  int *piVar1;
  DSectorPlaneInterpolation *this_00;
  long lVar2;
  DInterpolation *pDVar3;
  sector_t *psVar4;
  DObject *pointed;
  long lVar5;
  
  lVar5 = (long)position;
  if (*(long *)(this->terrainnum + lVar5 * 2 + 8) != 0) {
    if ((*(byte *)(*(long *)(this->terrainnum + lVar5 * 2 + 8) + 0x20) & 0x20) != 0) {
      (this->terrainnum + lVar5 * 2 + 8)[0] = 0;
      (this->terrainnum + lVar5 * 2 + 8)[1] = 0;
      goto LAB_0051a234;
    }
    goto LAB_0051a374;
  }
LAB_0051a234:
  switch(position) {
  case 0:
    this_00 = (DSectorPlaneInterpolation *)
              M_Malloc_Dbg(0x80,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                           ,0x1f9);
    DSectorPlaneInterpolation::DSectorPlaneInterpolation
              (this_00,(sector_t_conflict *)this,true,attach);
    break;
  case 1:
    this_00 = (DSectorPlaneInterpolation *)
              M_Malloc_Dbg(0x80,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                           ,0x1f9);
    DSectorPlaneInterpolation::DSectorPlaneInterpolation
              (this_00,(sector_t_conflict *)this,false,attach);
    break;
  case 2:
    this_00 = (DSectorPlaneInterpolation *)
              M_Malloc_Dbg(0x70,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                           ,0x1f9);
    DObject::DObject((DObject *)this_00);
    (this_00->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
    (this_00->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
    (this_00->super_DInterpolation).refcount = 0;
    (this_00->super_DInterpolation).super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_0070f0a0;
    this_00->sector = (sector_t_conflict *)this;
    this_00->ceiling = true;
    psVar4 = (sector_t *)(this->planes + 1);
    lVar2 = 0x60;
    goto LAB_0051a31c;
  case 3:
    this_00 = (DSectorPlaneInterpolation *)
              M_Malloc_Dbg(0x70,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                           ,0x1f9);
    DObject::DObject((DObject *)this_00);
    (this_00->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
    (this_00->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
    (this_00->super_DInterpolation).refcount = 0;
    (this_00->super_DInterpolation).super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_0070f0a0;
    this_00->sector = (sector_t_conflict *)this;
    this_00->ceiling = false;
    lVar2 = 8;
    psVar4 = this;
LAB_0051a31c:
    this_00->oldheight = psVar4->planes[0].xform.xOffs;
    this_00->oldtexz = *(double *)((long)&this->planes[0].xform.xOffs + lVar2);
    FInterpolator::AddInterpolation(&interpolator,&this_00->super_DInterpolation);
    break;
  default:
    goto switchD_0051a24d_default;
  }
  *(DSectorPlaneInterpolation **)(this->terrainnum + lVar5 * 2 + 8) = this_00;
LAB_0051a374:
  piVar1 = (int *)(*(long *)(this->terrainnum + lVar5 * 2 + 8) + 0x38);
  *piVar1 = *piVar1 + 1;
  pointed = *(DObject **)(this->terrainnum + lVar5 * 2 + 8);
  if ((pointed != (DObject *)0x0) && ((pointed->ObjectFlags & 0x20) != 0)) {
    (this->terrainnum + lVar5 * 2 + 8)[0] = 0;
    (this->terrainnum + lVar5 * 2 + 8)[1] = 0;
    pointed = (DObject *)0x0;
  }
  if (((pointed != (DObject *)0x0) && (GC::State == 1)) && ((pointed->ObjectFlags & 3) != 0)) {
    GC::Barrier((DObject *)0x0,pointed);
  }
  pDVar3 = *(DInterpolation **)(this->terrainnum + lVar5 * 2 + 8);
  if ((pDVar3 != (DInterpolation *)0x0) && (((pDVar3->super_DObject).ObjectFlags & 0x20) != 0)) {
    (this->terrainnum + lVar5 * 2 + 8)[0] = 0;
    (this->terrainnum + lVar5 * 2 + 8)[1] = 0;
switchD_0051a24d_default:
    pDVar3 = (DInterpolation *)0x0;
  }
  return pDVar3;
}

Assistant:

DInterpolation *sector_t::SetInterpolation(int position, bool attach)
{
	if (interpolations[position] == NULL)
	{
		DInterpolation *interp;
		switch (position)
		{
		case sector_t::CeilingMove:
			interp = new DSectorPlaneInterpolation(this, true, attach);
			break;

		case sector_t::FloorMove:
			interp = new DSectorPlaneInterpolation(this, false, attach);
			break;

		case sector_t::CeilingScroll:
			interp = new DSectorScrollInterpolation(this, true);
			break;

		case sector_t::FloorScroll:
			interp = new DSectorScrollInterpolation(this, false);
			break;

		default:
			return NULL;
		}
		interpolations[position] = interp;
	}
	interpolations[position]->AddRef();
	GC::WriteBarrier(interpolations[position]);
	return interpolations[position];
}